

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception-test.c++
# Opt level: O2

void __thiscall kj::_::anon_unknown_0::TestCase141::run(TestCase141 *this)

{
  undefined4 *puVar1;
  bool failure;
  bool success;
  UnwindDetector _kjUnwindDetector161;
  UnwindDetector _kjUnwindDetector160;
  UnwindDetector _kjUnwindDetector147;
  UnwindDetector _kjUnwindDetector146;
  
  UnwindDetector::UnwindDetector(&_kjUnwindDetector146);
  __kjUnwindDetector160 = &_kjUnwindDetector146;
  UnwindDetector::UnwindDetector(&_kjUnwindDetector147);
  __kjUnwindDetector161 = &_kjUnwindDetector147;
  Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception-test.c++:147:5)>
  ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_exception_test_c__:147:5)>
               *)&_kjUnwindDetector161);
  Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception-test.c++:146:5)>
  ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_exception_test_c__:146:5)>
               *)&_kjUnwindDetector160);
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[25]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception-test.c++"
               ,0x99,ERROR,"\"failed: expected \" \"success\"",
               (char (*) [25])"failed: expected success");
  }
  UnwindDetector::UnwindDetector(&_kjUnwindDetector160);
  UnwindDetector::UnwindDetector(&_kjUnwindDetector161);
  puVar1 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar1 = 1;
  __cxa_throw(puVar1,&int::typeinfo,0);
}

Assistant:

TEST(Exception, ScopeSuccessFail) {
  bool success = false;
  bool failure = false;

  {
    KJ_ON_SCOPE_SUCCESS(success = true);
    KJ_ON_SCOPE_FAILURE(failure = true);

    EXPECT_FALSE(success);
    EXPECT_FALSE(failure);
  }

  EXPECT_TRUE(success);
  EXPECT_FALSE(failure);

  success = false;
  failure = false;

  try {
    KJ_ON_SCOPE_SUCCESS(success = true);
    KJ_ON_SCOPE_FAILURE(failure = true);

    EXPECT_FALSE(success);
    EXPECT_FALSE(failure);

    throw 1;
  } catch (int) {}

  EXPECT_FALSE(success);
  EXPECT_TRUE(failure);
}